

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> * __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::processMessage
          (OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *__return_storage_ptr__,
          ZlibContext *this,ArrayPtr<const_unsigned_char> message,Maybe<unsigned_long> *maxSize,
          bool addNullTerminator)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  ArrayDisposer *pAVar5;
  ArrayDisposer *pAVar6;
  uchar *puVar7;
  ArrayDisposer *pAVar8;
  ulong uVar9;
  ArrayDisposer *pAVar10;
  ArrayDisposer *pAVar11;
  long lVar12;
  void *pvVar13;
  int iVar14;
  size_t sVar15;
  Result *__end3;
  ulong uVar16;
  ArrayDisposer *pAVar17;
  Result *__begin3;
  _func_int **pp_Var18;
  Result *pRVar19;
  bool _kjCondition;
  int local_1b0;
  char local_1a9;
  undefined8 *local_1a8;
  ArrayDisposer *local_1a0;
  int result;
  undefined8 *local_190;
  ArrayDisposer *local_188;
  ArrayDisposer *pAStack_180;
  ArrayDisposer *local_178;
  undefined8 *local_170;
  size_t currentIndex;
  anon_union_32_1_a8a2e026_for_OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_2
  local_158;
  ArrayDisposer *local_138;
  ZlibContext *local_130;
  Fault f;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> parts;
  Array<unsigned_char> buffer;
  Array<unsigned_char> processedMessage;
  ulong local_88;
  NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
  _kj_switch_subject;
  ulong local_38;
  
  (this->ctx).next_in = message.ptr;
  (this->ctx).avail_in = (uInt)message.size_;
  parts.builder.ptr = (Result *)0x0;
  parts.builder.pos =
       (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
  parts.builder.endPtr = (Result *)0x0;
  parts.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_1a9 = (maxSize->ptr).isSet;
  if ((bool)local_1a9 == true) {
    local_38 = (maxSize->ptr).field_1.value;
  }
  local_188 = (ArrayDisposer *)0x0;
  pAStack_180 = (ArrayDisposer *)0x0;
  local_178 = (ArrayDisposer *)0x0;
  local_1a8 = &NullArrayDisposer::instance;
  local_170 = &NullArrayDisposer::instance;
  local_1a0 = (ArrayDisposer *)local_158._8_8_;
  local_190 = (undefined8 *)local_158._24_8_;
  local_88 = 0;
  iVar14 = (int)currentIndex;
  local_130 = this;
  do {
    buffer.ptr = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                    (1,0x1000,0x1000,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
    buffer.size_ = 0x1000;
    buffer.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    (local_130->ctx).next_out = buffer.ptr;
    (local_130->ctx).avail_out = 0x1000;
    result = 0;
    if (local_130->mode == DECOMPRESS) {
      result = inflate(&this->ctx,2);
      _kjCondition = (uint)result < 2 || result == 0xfffffffb;
      if ((1 < (uint)result) && (result != 0xfffffffb)) {
        local_158._8_8_ = local_1a0;
        local_158._24_8_ = local_190;
        local_170 = local_1a8;
        currentIndex = CONCAT44(currentIndex._4_4_,iVar14);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[21],int&,char_const(&)[13],char*&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xd2f,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END"
                   ,"_kjCondition,\"Decompression failed\", result, \" with reason\", ctx.msg",
                   &_kjCondition,(char (*) [21])"Decompression failed",&result,
                   (char (*) [13])" with reason",&(local_130->ctx).msg);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else if (local_130->mode == COMPRESS) {
      result = deflate(&this->ctx,2);
      _kjCondition = (uint)result < 2 || result == 0xfffffffb;
      if ((1 < (uint)result) && (result != 0xfffffffb)) {
        local_158._8_8_ = local_1a0;
        local_158._24_8_ = local_190;
        local_170 = local_1a8;
        currentIndex = CONCAT44(currentIndex._4_4_,iVar14);
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[19],int&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xd2a,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END"
                   ,"_kjCondition,\"Compression failed\", result",&_kjCondition,
                   (char (*) [19])"Compression failed",&result);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    pAVar5 = buffer.disposer;
    sVar15 = buffer.size_;
    puVar7 = buffer.ptr;
    iVar4 = result;
    processedMessage.size_ = (size_t)buffer.ptr;
    buffer.ptr = (uchar *)0x0;
    buffer.size_ = 0;
    uVar16 = (ulong)(local_130->ctx).avail_out;
    pp_Var18 = (_func_int **)-(uVar16 - 0x1000);
    local_1b0 = iVar14;
    if (uVar16 == 0x1000) {
LAB_003b162e:
      if ((local_130->ctx).avail_in == 0) {
        bVar3 = true;
        if (iVar4 == 1 || (local_130->ctx).avail_out != 0) {
          if (iVar4 == 1) goto LAB_003b1905;
          goto LAB_003b1912;
        }
      }
      else {
        bVar3 = true;
        if (iVar4 == 1) {
LAB_003b1905:
          reset(local_130);
LAB_003b1912:
          local_1a0 = pAStack_180;
          local_158._0_8_ = local_188;
          local_158._16_8_ = local_178;
          local_188 = (ArrayDisposer *)0x0;
          pAStack_180 = (ArrayDisposer *)0x0;
          local_178 = (ArrayDisposer *)0x0;
          local_1b0 = 1;
          bVar3 = false;
          local_190 = local_1a8;
        }
      }
    }
    else {
      if (pAStack_180 == local_178) {
        uVar16 = ((long)local_178 - (long)local_188 >> 3) * -0x6666666666666666;
        if (local_178 == local_188) {
          uVar16 = 4;
        }
        local_138 = local_188;
        uVar9 = ((long)pAStack_180 - (long)local_188 >> 3) * -0x3333333333333333;
        pAVar17 = pAStack_180;
        if (uVar16 <= uVar9 && uVar9 - uVar16 != 0) {
          pAVar11 = local_188 + uVar16 * 5;
          pAVar8 = pAStack_180;
          while (pAVar17 = pAVar8, pAVar11 < pAVar17) {
            pp_Var1 = pAVar17[-4]._vptr_ArrayDisposer;
            pAVar8 = pAVar17 + -5;
            if (pp_Var1 != (_func_int **)0x0) {
              pp_Var2 = pAVar17[-3]._vptr_ArrayDisposer;
              pAVar17[-4]._vptr_ArrayDisposer = (_func_int **)0x0;
              pAVar17[-3]._vptr_ArrayDisposer = (_func_int **)0x0;
              (**(code **)*pAVar17[-2]._vptr_ArrayDisposer)
                        (pAVar17[-2]._vptr_ArrayDisposer,pp_Var1,1,pp_Var2,pp_Var2,0);
            }
          }
        }
        pAStack_180 = pAVar17;
        pAVar10 = (ArrayDisposer *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0x28,0,uVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        pAVar6 = local_138;
        pAVar8 = pAStack_180;
        buffer.disposer = pAVar10 + uVar16 * 5;
        pAVar17 = pAVar10;
        for (pAVar11 = local_138; pAVar11 != pAStack_180; pAVar11 = pAVar11 + 5) {
          *(undefined4 *)&pAVar17->_vptr_ArrayDisposer =
               *(undefined4 *)&pAVar11->_vptr_ArrayDisposer;
          pAVar17[1]._vptr_ArrayDisposer = pAVar11[1]._vptr_ArrayDisposer;
          pAVar17[2]._vptr_ArrayDisposer = pAVar11[2]._vptr_ArrayDisposer;
          pAVar17[3]._vptr_ArrayDisposer = pAVar11[3]._vptr_ArrayDisposer;
          pAVar11[1]._vptr_ArrayDisposer = (_func_int **)0x0;
          pAVar11[2]._vptr_ArrayDisposer = (_func_int **)0x0;
          pAVar17[4]._vptr_ArrayDisposer = pAVar11[4]._vptr_ArrayDisposer;
          pAVar17 = pAVar17 + 5;
        }
        local_178 = buffer.disposer;
        buffer.ptr = (uchar *)pAVar10;
        buffer.size_ = (size_t)pAVar17;
        if (local_138 != (ArrayDisposer *)0x0) {
          local_188 = (ArrayDisposer *)0x0;
          pAStack_180 = (ArrayDisposer *)0x0;
          local_178 = (ArrayDisposer *)0x0;
          lVar12 = (long)pAVar8 - (long)local_138;
          local_138 = buffer.disposer;
          (**(code **)*local_1a8)(local_1a8,pAVar6,0x28,(lVar12 >> 3) * -0x3333333333333333);
          local_178 = local_138;
        }
        local_1a8 = &kj::_::HeapArrayDisposer::instance;
        local_188 = pAVar10;
        pAStack_180 = pAVar17;
      }
      *(int *)&pAStack_180->_vptr_ArrayDisposer = iVar4;
      pAStack_180[1]._vptr_ArrayDisposer = (_func_int **)puVar7;
      pAStack_180[2]._vptr_ArrayDisposer = (_func_int **)sVar15;
      pAStack_180[3]._vptr_ArrayDisposer = (_func_int **)pAVar5;
      processedMessage.size_ = 0;
      pAStack_180[4]._vptr_ArrayDisposer = pp_Var18;
      pAStack_180 = pAStack_180 + 5;
      local_88 = local_88 + (long)pp_Var18;
      if ((local_1a9 == '\0') || (local_88 <= local_38)) goto LAB_003b162e;
      local_158._0_4_ = 0x3f1;
      local_158._16_8_ = (ArrayDisposer *)0x15;
      local_1b0 = 2;
      bVar3 = false;
      local_1a0 = (ArrayDisposer *)0x511d35;
    }
    if (processedMessage.size_ != 0) {
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,processedMessage.size_,1);
    }
    pAVar11 = local_178;
    pAVar17 = pAStack_180;
    pAVar5 = local_188;
    iVar14 = local_1b0;
  } while (bVar3);
  local_158._8_8_ = local_1a0;
  local_158._24_8_ = local_190;
  local_170 = local_1a8;
  currentIndex = CONCAT44(currentIndex._4_4_,local_1b0);
  if (local_188 != (ArrayDisposer *)0x0) {
    local_188 = (ArrayDisposer *)0x0;
    pAStack_180 = (ArrayDisposer *)0x0;
    local_178 = (ArrayDisposer *)0x0;
    (**(code **)*local_1a8)
              (local_1a8,pAVar5,0x28,((long)pAVar17 - (long)pAVar5 >> 3) * -0x3333333333333333,
               ((long)pAVar11 - (long)pAVar5 >> 3) * -0x3333333333333333,
               ArrayDisposer::
               Dispose_<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::destruct);
  }
  _kj_switch_subject.isSet = true;
  _kj_switch_subject.field_1.value.tag = iVar14;
  if (iVar14 == 2) {
    _kj_switch_subject.field_1._24_8_ = local_158._16_8_;
    _kj_switch_subject.field_1._8_8_ = local_158._0_8_;
    _kj_switch_subject.field_1._16_8_ = local_158._8_8_;
  }
  else if (iVar14 == 1) {
    _kj_switch_subject.field_1._8_8_ = local_158._0_8_;
    _kj_switch_subject.field_1._16_8_ = local_158._8_8_;
    _kj_switch_subject.field_1._24_8_ = local_158._16_8_;
    _kj_switch_subject.field_1._32_8_ = local_158._24_8_;
    local_158._0_8_ = (ArrayDisposer *)0x0;
    local_158._8_8_ = (ArrayDisposer *)0x0;
    local_158._16_8_ = (ArrayDisposer *)0x0;
  }
  OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
  ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
            *)&currentIndex);
  if (iVar14 == 1) {
    parts.builder.ptr = (Result *)_kj_switch_subject.field_1._8_8_;
    parts.builder.pos =
         (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
         _kj_switch_subject.field_1._16_8_;
    parts.builder.endPtr = (Result *)_kj_switch_subject.field_1._24_8_;
    parts.builder.disposer = (ArrayDisposer *)_kj_switch_subject.field_1._32_8_;
    _kj_switch_subject.field_1._8_8_ = 0;
    _kj_switch_subject.field_1._16_8_ = 0;
    _kj_switch_subject.field_1._24_8_ = 0;
  }
  else if (iVar14 == 2) {
    __return_storage_ptr__->tag = 2;
    *(undefined8 *)&__return_storage_ptr__->field_1 = _kj_switch_subject.field_1._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = _kj_switch_subject.field_1._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
         _kj_switch_subject.field_1._24_8_;
    OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
    ::~OneOf(&_kj_switch_subject.field_1.value);
    goto LAB_003b1c9e;
  }
  OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
  ::~OneOf(&_kj_switch_subject.field_1.value);
  lVar12 = 0;
  for (pRVar19 = parts.builder.ptr; pRVar19 != parts.builder.pos; pRVar19 = pRVar19 + 1) {
    lVar12 = lVar12 + pRVar19->size;
  }
  sVar15 = (ulong)addNullTerminator + lVar12;
  pvVar13 = kj::_::HeapArrayDisposer::allocateImpl
                      (1,sVar15,sVar15,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  currentIndex = 0;
  for (pRVar19 = parts.builder.ptr; pRVar19 != parts.builder.pos; pRVar19 = pRVar19 + 1) {
    memcpy((void *)((long)pvVar13 + currentIndex),(pRVar19->buffer).ptr,pRVar19->size);
    currentIndex = currentIndex + pRVar19->size;
  }
  if (addNullTerminator) {
    *(undefined1 *)((long)pvVar13 + currentIndex) = 0;
    currentIndex = currentIndex + 1;
  }
  _kj_switch_subject.field_1._8_8_ = anon_var_dwarf_4d228;
  _kj_switch_subject.field_1._16_8_ = 5;
  _kj_switch_subject.field_1._24_1_ = currentIndex == sVar15;
  _kj_switch_subject._0_8_ =
       (OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
        *)&currentIndex;
  _kj_switch_subject.field_1._0_8_ = sVar15;
  if (currentIndex != sVar15) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
              ((Fault *)&buffer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xd00,FAILED,"currentIndex == processedMessage.size()","_kjCondition,",
               (DebugComparison<unsigned_long_&,_unsigned_long> *)&_kj_switch_subject);
    kj::_::Debug::Fault::fatal((Fault *)&buffer);
  }
  __return_storage_ptr__->tag = 1;
  *(void **)&__return_storage_ptr__->field_1 = pvVar13;
  *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = sVar15;
  *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x10) =
       &kj::_::HeapArrayDisposer::instance;
LAB_003b1c9e:
  if (parts.builder.ptr != (Result *)0x0) {
    (**(parts.builder.disposer)->_vptr_ArrayDisposer)
              (parts.builder.disposer,parts.builder.ptr,0x28,
               ((long)parts.builder.pos - (long)parts.builder.ptr >> 3) * -0x3333333333333333,
               ((long)parts.builder.endPtr - (long)parts.builder.ptr >> 3) * -0x3333333333333333,
               ArrayDisposer::
               Dispose_<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<kj::Array<kj::byte>, ProtocolError> processMessage(kj::ArrayPtr<const byte> message,
        kj::Maybe<size_t> maxSize = kj::none,
        bool addNullTerminator = false) {
      // If `this` is the compressor, calling `processMessage()` will compress the `message`.
      // Likewise, if `this` is the decompressor, `processMessage()` will decompress the `message`.
      //
      // `maxSize` is only passed in when decompressing, since we want to ensure the decompressed
      // message is smaller than the `maxSize` passed to `receive()`.
      //
      // If (de)compression is successful, the result is returned as a Vector, otherwise,
      // an Exception is thrown.

      ctx.next_in = const_cast<byte*>(reinterpret_cast<const byte*>(message.begin()));
      ctx.avail_in = message.size();

      kj::Vector<Result> parts;
      KJ_SWITCH_ONEOF(processLoop(maxSize)) {
        KJ_CASE_ONEOF(protocolError, ProtocolError) {
          return kj::mv(protocolError);
        }
        KJ_CASE_ONEOF(dataParts, kj::Vector<Result>) {
          parts = kj::mv(dataParts);
        }
      }

      size_t amountToAllocate = 0;
      for (const auto& part : parts) {
        amountToAllocate += part.size;
      }

      if (addNullTerminator) {
        // Add space for the null-terminator.
        amountToAllocate += 1;
      }

      kj::Array<kj::byte> processedMessage = kj::heapArray<kj::byte>(amountToAllocate);
      size_t currentIndex = 0; // Current index into processedMessage.
      for (const auto& part : parts) {
        memcpy(&processedMessage[currentIndex], part.buffer.begin(), part.size);
        // We need to use `part.size` to determine the number of useful bytes, since data after
        // `part.size` is unused (and probably junk).
        currentIndex += part.size;
      }

      if (addNullTerminator) {
        processedMessage[currentIndex++] = '\0';
      }

      KJ_ASSERT(currentIndex == processedMessage.size());

      return kj::mv(processedMessage);
    }